

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

float xatlas::internal::triangleArea(Vector2 *a,Vector2 *b,Vector2 *c)

{
  Vector2 VVar1;
  Vector2 VVar2;
  undefined4 local_30;
  undefined4 uStack_2c;
  Vector2 v1;
  Vector2 v0;
  Vector2 *c_local;
  Vector2 *b_local;
  Vector2 *a_local;
  
  VVar1 = operator-(a,c);
  VVar2 = operator-(b,c);
  v1.x = VVar1.x;
  uStack_2c = VVar2.y;
  v1.y = VVar1.y;
  local_30 = VVar2.x;
  return (v1.x * uStack_2c + -(v1.y * local_30)) * 0.5;
}

Assistant:

static float triangleArea(const Vector2 &a, const Vector2 &b, const Vector2 &c)
{
	// IC: While it may be appealing to use the following expression:
	//return (c.x * a.y + a.x * b.y + b.x * c.y - b.x * a.y - c.x * b.y - a.x * c.y) * 0.5f;
	// That's actually a terrible idea. Small triangles far from the origin can end up producing fairly large floating point
	// numbers and the results becomes very unstable and dependent on the order of the factors.
	// Instead, it's preferable to subtract the vertices first, and multiply the resulting small values together. The result
	// in this case is always much more accurate (as long as the triangle is small) and less dependent of the location of
	// the triangle.
	//return ((a.x - c.x) * (b.y - c.y) - (a.y - c.y) * (b.x - c.x)) * 0.5f;
	const Vector2 v0 = a - c;
	const Vector2 v1 = b - c;
	return (v0.x * v1.y - v0.y * v1.x) * 0.5f;
}